

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

CURLcode send_telnet_data(Curl_easy *data,char *buffer,ssize_t nread)

{
  connectdata *pcVar1;
  int iVar2;
  void *pvVar3;
  pollfd local_70;
  pollfd pfd [1];
  TELNET *tn;
  connectdata *conn;
  size_t total_written;
  size_t bytes_written;
  uchar *puStack_40;
  CURLcode result;
  uchar *outbuf;
  size_t outlen;
  size_t i;
  ssize_t nread_local;
  char *buffer_local;
  Curl_easy *data_local;
  
  bytes_written._4_4_ = CURLE_OK;
  conn = (connectdata *)0x0;
  pcVar1 = data->conn;
  pfd[0] = *(pollfd *)&(data->req).p;
  if (nread < 0) {
    data_local._4_4_ = CURLE_TOO_LARGE;
  }
  else {
    i = nread;
    nread_local = (ssize_t)buffer;
    buffer_local = (char *)data;
    pvVar3 = memchr(buffer,0xff,nread);
    if (pvVar3 == (void *)0x0) {
      outbuf = (uchar *)i;
      puStack_40 = (uchar *)nread_local;
    }
    else {
      Curl_dyn_reset((dynbuf *)((long)pfd[0] + 0x1c28));
      for (outlen = 0; outlen < i && bytes_written._4_4_ == CURLE_OK; outlen = outlen + 1) {
        bytes_written._4_4_ =
             Curl_dyn_addn((dynbuf *)((long)pfd[0] + 0x1c28),(void *)(nread_local + outlen),1);
        if ((bytes_written._4_4_ == CURLE_OK) && (*(char *)(nread_local + outlen) == -1)) {
          bytes_written._4_4_ =
               Curl_dyn_addn((dynbuf *)((long)pfd[0] + 0x1c28),anon_var_dwarf_1293e7,1);
        }
      }
      outbuf = (uchar *)Curl_dyn_len((dynbuf *)((long)pfd[0] + 0x1c28));
      puStack_40 = Curl_dyn_uptr((dynbuf *)((long)pfd[0] + 0x1c28));
    }
    while (bytes_written._4_4_ == CURLE_OK && conn < outbuf) {
      local_70.fd = pcVar1->sock[0];
      local_70.events = 4;
      iVar2 = Curl_poll(&local_70,1,-1);
      if (iVar2 == -1 || iVar2 == 0) {
        bytes_written._4_4_ = CURLE_SEND_ERROR;
      }
      else {
        total_written = 0;
        bytes_written._4_4_ =
             Curl_xfer_send((Curl_easy *)buffer_local,puStack_40 + (long)conn,
                            (long)outbuf - (long)conn,false,&total_written);
        conn = (connectdata *)((long)&(conn->cpool_node)._list + total_written);
      }
    }
    data_local._4_4_ = bytes_written._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode send_telnet_data(struct Curl_easy *data,
                                 char *buffer, ssize_t nread)
{
  size_t i, outlen;
  unsigned char *outbuf;
  CURLcode result = CURLE_OK;
  size_t bytes_written;
  size_t total_written = 0;
  struct connectdata *conn = data->conn;
  struct TELNET *tn = data->req.p.telnet;

  DEBUGASSERT(tn);
  DEBUGASSERT(nread > 0);
  if(nread < 0)
    return CURLE_TOO_LARGE;

  if(memchr(buffer, CURL_IAC, nread)) {
    /* only use the escape buffer when necessary */
    Curl_dyn_reset(&tn->out);

    for(i = 0; i < (size_t)nread && !result; i++) {
      result = Curl_dyn_addn(&tn->out, &buffer[i], 1);
      if(!result && ((unsigned char)buffer[i] == CURL_IAC))
        /* IAC is FF in hex */
        result = Curl_dyn_addn(&tn->out, "\xff", 1);
    }

    outlen = Curl_dyn_len(&tn->out);
    outbuf = Curl_dyn_uptr(&tn->out);
  }
  else {
    outlen = (size_t)nread;
    outbuf = (unsigned char *)buffer;
  }
  while(!result && total_written < outlen) {
    /* Make sure socket is writable to avoid EWOULDBLOCK condition */
    struct pollfd pfd[1];
    pfd[0].fd = conn->sock[FIRSTSOCKET];
    pfd[0].events = POLLOUT;
    switch(Curl_poll(pfd, 1, -1)) {
      case -1:                    /* error, abort writing */
      case 0:                     /* timeout (will never happen) */
        result = CURLE_SEND_ERROR;
        break;
      default:                    /* write! */
        bytes_written = 0;
        result = Curl_xfer_send(data, outbuf + total_written,
                                outlen - total_written, FALSE, &bytes_written);
        total_written += bytes_written;
        break;
    }
  }

  return result;
}